

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pb.cpp
# Opt level: O1

void poisbinom(double *p_value_poisbinom,int *I1_l,int *I2_l,int n,int m,uint g)

{
  int iVar1;
  int iVar2;
  void *pvVar3;
  void *pvVar4;
  void *pvVar5;
  long *plVar6;
  void *pvVar7;
  long lVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  double dVar16;
  double dVar17;
  
  uVar15 = (ulong)(uint)m;
  uVar10 = (long)n * 8 + 8;
  if (n < -1) {
    uVar10 = 0xffffffffffffffff;
  }
  pvVar4 = operator_new__(uVar10);
  if (-1 < n) {
    uVar10 = (long)m * 8 + 8;
    if (m < -1) {
      uVar10 = 0xffffffffffffffff;
    }
    uVar9 = 0;
    do {
      pvVar5 = operator_new__(uVar10);
      *(void **)((long)pvVar4 + uVar9 * 8) = pvVar5;
      uVar9 = uVar9 + 1;
    } while (n + 1 != uVar9);
  }
  uVar10 = (long)m * 8 + 8;
  if (m < -1) {
    uVar10 = 0xffffffffffffffff;
  }
  pvVar5 = operator_new__(uVar10);
  if (0 < m) {
    uVar9 = 1;
    do {
      dVar16 = 1.0;
      if (0 < n) {
        iVar1 = I2_l[uVar9];
        uVar12 = 1;
        dVar16 = 1.0;
        do {
          lVar8 = *(long *)((long)pvVar4 + uVar12 * 8);
          *(undefined8 *)(lVar8 + uVar9 * 8) = 0;
          iVar2 = I1_l[uVar12];
          iVar14 = iVar2;
          if (iVar1 < iVar2) {
            iVar14 = iVar1;
          }
          if (0 < iVar14) {
            *(double *)(lVar8 + uVar9 * 8) = (double)(iVar2 + iVar1 + -1);
          }
          dVar17 = *(double *)(lVar8 + uVar9 * 8) / (double)g;
          *(double *)(lVar8 + uVar9 * 8) = dVar17;
          dVar16 = dVar16 * (1.0 - dVar17);
          uVar12 = uVar12 + 1;
        } while (n + 1 != uVar12);
      }
      *(double *)((long)pvVar5 + uVar9 * 8) = 1.0 - dVar16;
      uVar9 = uVar9 + 1;
    } while (uVar9 != m + 1);
  }
  plVar6 = (long *)operator_new__(uVar10);
  if (-1 < m) {
    uVar9 = 0;
    do {
      pvVar7 = operator_new__(uVar10);
      plVar6[uVar9] = (long)pvVar7;
      uVar9 = uVar9 + 1;
    } while (m + 1 != uVar9);
  }
  if (-1 < m) {
    lVar8 = 0;
    uVar9 = 0;
    pvVar7 = pvVar5;
    do {
      lVar13 = 0;
      do {
        if ((int)uVar9 + (int)lVar13 == 0 && (int)uVar9 == 0) {
          *(undefined8 *)*plVar6 = 0x3ff0000000000000;
        }
        else {
          if (uVar9 == 0) {
            lVar11 = *plVar6 + lVar8;
            dVar16 = (1.0 - *(double *)((long)pvVar7 + lVar13 * 8)) *
                     *(double *)(lVar11 + -8 + lVar13 * 8);
          }
          else {
            dVar16 = *(double *)((long)pvVar7 + lVar13 * 8);
            if (lVar13 != 0) {
              *(double *)(plVar6[uVar9] + lVar8 + lVar13 * 8) =
                   (1.0 - dVar16) * *(double *)(plVar6[uVar9] + lVar8 + -8 + lVar13 * 8) +
                   dVar16 * *(double *)(plVar6[uVar9 - 1] + lVar8 + -8 + lVar13 * 8);
              goto LAB_00107bc7;
            }
            dVar16 = dVar16 * *(double *)(plVar6[uVar9 - 1] + lVar8 + -8);
            lVar11 = plVar6[uVar9] + lVar8;
          }
          *(double *)(lVar11 + lVar13 * 8) = dVar16;
        }
LAB_00107bc7:
        lVar13 = lVar13 + 1;
      } while ((uVar9 - (m + 1)) + lVar13 != 0);
      uVar9 = uVar9 + 1;
      lVar8 = lVar8 + 8;
      pvVar7 = (void *)((long)pvVar7 + 8);
    } while (uVar9 != m + 1);
  }
  pvVar7 = operator_new__(uVar10);
  if (-1 < m) {
    lVar8 = uVar15 * 8 + 8;
    lVar13 = 0;
    do {
      lVar11 = lVar13 + -1;
      if (lVar13 == 0) {
        *(undefined8 *)((long)pvVar7 + uVar15 * 8) = *(undefined8 *)(plVar6[uVar15] + uVar15 * 8);
      }
      else {
        *(double *)((long)pvVar7 + lVar11 * 8 + lVar8) =
             *(double *)((long)pvVar7 + lVar13 * 8 + lVar8) +
             *(double *)(plVar6[uVar15 + lVar13] + uVar15 * 8);
      }
      lVar13 = lVar11;
    } while (-lVar11 != (ulong)(m + 1));
  }
  if (-1 < m) {
    memcpy(p_value_poisbinom,pvVar7,uVar15 * 8 + 8);
    uVar10 = 0;
    do {
      if ((void *)plVar6[uVar10] != (void *)0x0) {
        operator_delete__((void *)plVar6[uVar10]);
      }
      uVar10 = uVar10 + 1;
    } while (m + 1 != uVar10);
  }
  if (-1 < n) {
    uVar10 = 0;
    do {
      pvVar3 = *(void **)((long)pvVar4 + uVar10 * 8);
      if (pvVar3 != (void *)0x0) {
        operator_delete__(pvVar3);
      }
      uVar10 = uVar10 + 1;
    } while (n + 1 != uVar10);
  }
  operator_delete__(pvVar4);
  operator_delete__(pvVar5);
  operator_delete__(plVar6);
  operator_delete__(pvVar7);
  return;
}

Assistant:

void poisbinom(double* p_value_poisbinom, int* I1_l, int* I2_l, int n, int m, unsigned int g)
{
    double** q = new double* [n+1];
    for(int i=0; i<n+1; i++)
        q[i] = new double [m+1];
    double prod;
    double* p = new double [m+1];
    for(int j=1; j<=m; j++){
        int z = ceil(double(I2_l[j])/2);
        z = 1;
        prod = 1;
        for(int i=1; i<=n; i++){
            q[i][j] = 0;
            if (z<=min(I1_l[i], I2_l[j]))
                q[i][j] = I1_l[i] + I2_l[j] - 2*z + 1;
            q[i][j] = q[i][j]/g;
            prod *= (1-q[i][j]);
        }
        p[j] = 1-prod;
    }

    double** x = new double* [m+1];
    for(int k=0; k<=m; k++)
       x[k] = new double [m+1];
    for(int k=0; k<=m; k++)
    {
       for(int j=k; j<=m; j++)
       {
            if(k==0 && j==0)
                x[k][j] = 1;
            else if(k==0)
                x[k][j] = x[k][j-1] * (1-p[j]);
            else if(k==j)
                x[k][j] = x[k-1][j-1] * (p[j]);
            else
            {
                x[k][j] = x[k][j-1] * (1-p[j]) + x[k-1][j-1] * (p[j]);
            }

       }
    }
    double* CumSum = new double [m+1];
    for(int k=0; k<=m; k++)
    {
        if (k==0)
        {
            CumSum[m] = x[m][m];
        }
        else CumSum[m-k] = CumSum[m-k+1] + x[m-k][m];
    }
    for(int k=0; k<=m; k++)
    {
        p_value_poisbinom[k] = CumSum[k];
    }

    for(int k=0; k<=m; k++)
    {
        delete [] x[k];
    }
    for(int i=0; i<n+1; i++)
        delete [] q[i];
    delete [] q;
    delete [] p;
    delete [] x;
    delete [] CumSum;
}